

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RankPreservingReshapeLayerParams::RankPreservingReshapeLayerParams
          (RankPreservingReshapeLayerParams *this,RankPreservingReshapeLayerParams *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__RankPreservingReshapeLayerParams_00703a18;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->targetshape_).current_size_ = 0;
  (this->targetshape_).total_size_ = 0;
  (this->targetshape_).rep_ = (Rep *)0x0;
  new_size = (from->targetshape_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<long>::Reserve(&this->targetshape_,new_size);
    memcpy(((this->targetshape_).rep_)->elements,((from->targetshape_).rep_)->elements,
           (long)(from->targetshape_).current_size_ << 3);
    (this->targetshape_).current_size_ = (from->targetshape_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

RankPreservingReshapeLayerParams::RankPreservingReshapeLayerParams(const RankPreservingReshapeLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      targetshape_(from.targetshape_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.RankPreservingReshapeLayerParams)
}